

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::ServiceDescriptor::CopyTo(ServiceDescriptor *this,ServiceDescriptorProto *proto)

{
  int iVar1;
  ServiceOptions *this_00;
  ServiceOptions *pSVar2;
  MethodDescriptor *in_RSI;
  ServiceDescriptor *in_RDI;
  int i;
  string *in_stack_ffffffffffffffb8;
  ServiceDescriptorProto *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar3;
  int index;
  
  name_abi_cxx11_(in_RDI);
  ServiceDescriptorProto::set_name(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  iVar3 = 0;
  while( true ) {
    index = iVar3;
    iVar1 = method_count(in_RDI);
    if (iVar1 <= iVar3) break;
    method(in_RDI,index);
    ServiceDescriptorProto::add_method((ServiceDescriptorProto *)0x4ad875);
    MethodDescriptor::CopyTo
              (in_RSI,(MethodDescriptorProto *)CONCAT44(index,in_stack_ffffffffffffffe8));
    iVar3 = index + 1;
  }
  this_00 = options(in_RDI);
  pSVar2 = ServiceOptions::default_instance();
  if (this_00 != pSVar2) {
    pSVar2 = ServiceDescriptorProto::mutable_options((ServiceDescriptorProto *)0x4ad8ba);
    options(in_RDI);
    ServiceOptions::CopyFrom(this_00,pSVar2);
  }
  return;
}

Assistant:

void ServiceDescriptor::CopyTo(ServiceDescriptorProto* proto) const {
  proto->set_name(name());

  for (int i = 0; i < method_count(); i++) {
    method(i)->CopyTo(proto->add_method());
  }

  if (&options() != &ServiceOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}